

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall ON_PolyCurve::SwapCoordinates(ON_PolyCurve *this,int i,int j)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ON_Curve **ppOVar4;
  bool local_31;
  bool local_21;
  int local_20;
  bool rc;
  int segment_index;
  int count;
  int j_local;
  int i_local;
  ON_PolyCurve *this_local;
  
  iVar2 = Count(this);
  bVar1 = -(0 < iVar2);
  local_20 = 0;
  while( true ) {
    local_21 = (bool)(bVar1 & 1);
    local_31 = false;
    if (local_20 < iVar2) {
      local_31 = local_21;
    }
    if (local_31 == false) break;
    ppOVar4 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_20);
    iVar3 = (*((*ppOVar4)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1f])
                      (*ppOVar4,(ulong)(uint)i,(ulong)(uint)j);
    bVar1 = (byte)iVar3;
    local_20 = local_20 + 1;
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return local_21;
}

Assistant:

bool
ON_PolyCurve::SwapCoordinates( int i, int j )
{
  const int count = Count();
  int segment_index;
  bool rc = (count>0) ? true : false;
  for ( segment_index = 0; segment_index < count && rc; segment_index++ ) {
    rc = m_segment[segment_index]->SwapCoordinates( i, j );
  }
	DestroyCurveTree();
  return rc;
}